

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O2

var * __thiscall
cs::structure::get_var<std::__cxx11::string_const&>
          (structure *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name)

{
  bool bVar1;
  var *pvVar2;
  runtime_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  bVar1 = domain_type::exist((this->m_data).
                             super___shared_ptr<cs::domain_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                             name);
  if (bVar1) {
    pvVar2 = domain_type::get_var_no_check
                       ((this->m_data).
                        super___shared_ptr<cs::domain_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr,name)
    ;
    return pvVar2;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x28);
  std::operator+(&local_a0,"Struct \"",&this->m_name);
  std::operator+(&local_80,&local_a0,"\" have no member called \"");
  std::__cxx11::string::string((string *)&local_c0,(string *)name);
  std::operator+(&local_60,&local_80,&local_c0);
  std::operator+(&local_40,&local_60,"\".");
  runtime_error::runtime_error(this_00,&local_40);
  __cxa_throw(this_00,&runtime_error::typeinfo,runtime_error::~runtime_error);
}

Assistant:

var &get_var(T &&name) const
		{
			if (m_data->exist(name))
				return m_data->get_var_no_check(name);
			else
				throw runtime_error("Struct \"" + m_name + "\" have no member called \"" + std::string(name) + "\".");
		}